

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_type.cpp
# Opt level: O0

void duckdb::VectorTypeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference this;
  Vector *in_RDX;
  string_t *data;
  size_type in_stack_ffffffffffffff78;
  VectorType in_stack_ffffffffffffffaf;
  string local_50 [32];
  anon_struct_16_3_d7536bce_for_pointer local_30;
  string_t *local_20;
  Vector *local_18;
  
  local_18 = in_RDX;
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  local_20 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xd2aab2);
  this = vector<duckdb::Vector,_true>::operator[]
                   ((vector<duckdb::Vector,_true> *)local_18,in_stack_ffffffffffffff78);
  Vector::GetVectorType(this);
  EnumUtil::ToString<duckdb::VectorType>(in_stack_ffffffffffffffaf);
  local_30 = (anon_struct_16_3_d7536bce_for_pointer)
             duckdb::StringVector::AddString(local_18,local_50);
  (local_20->value).pointer = local_30;
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

static void VectorTypeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto data = ConstantVector::GetData<string_t>(result);
	data[0] = StringVector::AddString(result, EnumUtil::ToString(input.data[0].GetVectorType()));
}